

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::Lookup::reportUndeclared
               (Scope *initialScope,string_view name,SourceRange range,
               bitmask<slang::ast::LookupFlags> flags,bool isHierarchical,LookupResult *result)

{
  Compilation *this;
  WildcardImportData *pWVar1;
  pointer ppWVar2;
  string_view name_00;
  string_view arg;
  string_view lookupName;
  string_view lookupName_00;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  anon_class_16_2_6bb36380 *this_00;
  bool bVar3;
  Symbol *sym;
  PackageSymbol *pPVar4;
  Diagnostic *this_01;
  Diagnostic *pDVar5;
  DiagCode code;
  SourceLocation SVar6;
  pointer ppWVar7;
  Scope *scope;
  Scope *this_02;
  string_view arg_03;
  SourceRange range_00;
  int bestDistance;
  Symbol *closestSym;
  anon_class_16_2_6bb36380 isViable;
  anon_class_32_4_3ecd27ba checkMembers;
  size_t local_98;
  char *local_90;
  SourceLocation local_88;
  SourceLocation local_80;
  undefined1 local_74 [12];
  Scope *local_68;
  undefined1 local_60 [16];
  anon_class_32_4_3ecd27ba local_50;
  
  local_90 = name._M_str;
  local_98 = name._M_len;
  if ((flags.m_bits & 8) != 0) {
    return;
  }
  local_68 = initialScope;
  if (((flags.m_bits & 0x10) != 0) && (bVar3 = Scope::isUninstantiated(initialScope), bVar3)) {
    return;
  }
  if (((result->flags).m_bits & 4) != 0) {
    return;
  }
  this = local_68->compilation;
  local_74._4_8_ = 0;
  local_74._0_4_ = 0x7fffffff;
  scope = local_68;
  this_02 = local_68;
  local_88 = range.startLoc;
  local_80 = range.endLoc;
  while ((local_60._0_4_ = flags.m_bits, local_60._8_8_ = scope, (flags.m_bits & 2) != 0 ||
         (name_00._M_str = local_90, name_00._M_len = local_98, sym = Scope::find(this_02,name_00),
         sym == (Symbol *)0x0))) {
    if (this->typoCorrections < (this->options).typoCorrectionLimit) {
      local_50.isViable = (anon_class_16_2_6bb36380 *)local_60;
      local_50.bestDistance = (int *)local_74;
      local_50.closestSym = (Symbol **)(local_74 + 4);
      local_50.name = (string_view *)&local_98;
      reportUndeclared::anon_class_32_4_3ecd27ba::operator()
                ((anon_class_32_4_3ecd27ba *)(local_60 + 0x10),this_02);
      pWVar1 = this_02->importData;
      scope = local_68;
      if (pWVar1 != (WildcardImportData *)0x0) {
        ppWVar2 = (pWVar1->wildcardImports).
                  super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppWVar7 = (pWVar1->wildcardImports).
                       super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; scope = local_68,
            ppWVar7 != ppWVar2; ppWVar7 = ppWVar7 + 1) {
          pPVar4 = WildcardImportSymbol::getPackage(*ppWVar7);
          if (pPVar4 != (PackageSymbol *)0x0) {
            reportUndeclared::anon_class_32_4_3ecd27ba::operator()
                      ((anon_class_32_4_3ecd27ba *)(local_60 + 0x10),&pPVar4->super_Scope);
          }
        }
      }
    }
    this_02 = this_02->thisSym->parentScope;
    if ((this_02 == (Scope *)0x0) ||
       (((flags.m_bits >> 0xe & 1) != 0 && (this_02->thisSym->kind == CompilationUnit))))
    goto LAB_003ca8a1;
  }
  bVar3 = reportUndeclared::anon_class_16_2_6bb36380::operator()
                    ((anon_class_16_2_6bb36380 *)local_60,sym);
  if (bVar3) {
    sourceRange.endLoc = local_80;
    sourceRange.startLoc = local_88;
    pDVar5 = LookupResult::addDiag(result,scope,(DiagCode)0x3e000a,sourceRange);
    arg._M_str = local_90;
    arg._M_len = local_98;
    Diagnostic::operator<<(pDVar5,arg);
    SVar6 = sym->location;
    goto LAB_003ca9cc;
  }
LAB_003ca8a1:
  lookupName._M_str = local_90;
  lookupName._M_len = local_98;
  Compilation::tryGetDefinition((DefinitionLookupResult *)(local_60 + 0x10),this,lookupName,scope);
  this_00 = local_50.isViable;
  if (((DefinitionSymbol *)local_50.isViable == (DefinitionSymbol *)0x0) ||
     (((Symbol *)&(local_50.isViable)->flags)->kind != Definition)) {
    lookupName_00._M_str = local_90;
    lookupName_00._M_len = local_98;
    pPVar4 = Compilation::getPackage(this,lookupName_00);
    SVar6 = local_80;
    if (pPVar4 != (PackageSymbol *)0x0) {
      pDVar5 = LookupResult::addDiag(result,scope,(DiagCode)0x33000a,local_80);
      arg_00._M_str = local_90;
      arg_00._M_len = local_98;
      pDVar5 = Diagnostic::operator<<(pDVar5,arg_00);
      range_00.endLoc = SVar6;
      range_00.startLoc = local_88;
      Diagnostic::operator<<(pDVar5,range_00);
      return;
    }
    this->typoCorrections = this->typoCorrections + 1;
    if ((0 < (int)local_74._0_4_ && local_74._4_8_ != 0) && (2 < local_98 / (uint)local_74._0_4_)) {
      sourceRange_00.endLoc = local_80;
      sourceRange_00.startLoc = local_88;
      pDVar5 = LookupResult::addDiag(result,scope,(DiagCode)0x32000a,sourceRange_00);
      arg_01._M_str = local_90;
      arg_01._M_len = local_98;
      this_01 = Diagnostic::operator<<(pDVar5,arg_01);
      Diagnostic::operator<<(this_01,*(string_view *)(local_74._4_8_ + 8));
      SVar6 = *(SourceLocation *)(local_74._4_8_ + 0x18);
LAB_003ca9cc:
      Diagnostic::addNote(pDVar5,(DiagCode)0x50001,SVar6);
      return;
    }
    code.subsystem = Lookup;
    code.code = 0x34;
  }
  else {
    if (!isHierarchical) {
      sourceRange_02.endLoc = local_80;
      sourceRange_02.startLoc = local_88;
      pDVar5 = LookupResult::addDiag
                         (result,scope,(DiagCode)((uint)((flags.m_bits & 1) == 0) << 0x10 | 0x6000a)
                          ,sourceRange_02);
      arg_02._M_str = local_90;
      arg_02._M_len = local_98;
      pDVar5 = Diagnostic::operator<<(pDVar5,arg_02);
      arg_03 = DefinitionSymbol::getArticleKindString((DefinitionSymbol *)this_00);
      goto LAB_003caa56;
    }
    code.subsystem = Lookup;
    code.code = 5;
  }
  sourceRange_01.endLoc = local_80;
  sourceRange_01.startLoc = local_88;
  pDVar5 = LookupResult::addDiag(result,scope,code,sourceRange_01);
  arg_03._M_str = local_90;
  arg_03._M_len = local_98;
LAB_003caa56:
  Diagnostic::operator<<(pDVar5,arg_03);
  return;
}

Assistant:

void Lookup::reportUndeclared(const Scope& initialScope, std::string_view name, SourceRange range,
                              bitmask<LookupFlags> flags, bool isHierarchical,
                              LookupResult& result) {
    // If the caller doesn't want an error, don't give him one.
    if (flags.has(LookupFlags::NoUndeclaredError) ||
        (flags.has(LookupFlags::NoUndeclaredErrorIfUninstantiated) &&
         initialScope.isUninstantiated())) {
        return;
    }

    // If we observed a wildcard import we couldn't resolve, we shouldn't report an
    // error for an undeclared identifier because maybe it's supposed to come from that package.
    // In particular it's important that we do this because when we first look at a
    // definition because it's possible we haven't seen the file containing the package yet.
    // This also gets set for class scopes that have an error base class.
    if (result.flags.has(LookupResultFlags::SuppressUndeclared))
        return;

    // The symbol wasn't found, so this is an error. The only question is how helpful we can
    // make that error. Let's try to find the closest named symbol in all reachable scopes,
    // including package imports, to provide a "did you mean" diagnostic. If along the way
    // we happen to actually find the symbol but it's declared later in the source text,
    // we will use that to issue a "used before declared" diagnostic.
    auto& comp = initialScope.getCompilation();
    const Symbol* actualSym = nullptr;
    const Symbol* closestSym = nullptr;
    int bestDistance = INT_MAX;
    bool usedBeforeDeclared = false;
    auto scope = &initialScope;
    while (true) {
        // This lambda returns true if the given symbol is a viable candidate
        // for the kind of lookup that was being performed.
        auto isViable = [flags, &initialScope](const Symbol& sym) {
            const Symbol* s = &sym;
            if (s->kind == SymbolKind::TransparentMember)
                s = &s->as<TransparentMemberSymbol>().wrapped;

            if (flags.has(LookupFlags::Type)) {
                if (!s->isType() && s->kind != SymbolKind::TypeParameter &&
                    s->kind != SymbolKind::GenericClassDef) {
                    return false;
                }
            }
            else {
                switch (s->kind) {
                    case SymbolKind::Subroutine:
                    case SymbolKind::InstanceArray:
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                    case SymbolKind::Checker:
                    case SymbolKind::UninstantiatedDef:
                        break;
                    case SymbolKind::Instance:
                        if (!s->as<InstanceSymbol>().isInterface())
                            return false;
                        break;
                    default:
                        if (!s->isValue())
                            return false;
                        break;
                }
            }

            // Ignore special members.
            if (s->kind == SymbolKind::Subroutine &&
                s->as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
                return false;
            }

            if (VariableSymbol::isKind(s->kind) &&
                s->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {
                return false;
            }

            if (!isVisibleFrom(*s, initialScope))
                return false;

            return true;
        };

        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            actualSym = scope->find(name);
            if (actualSym) {
                usedBeforeDeclared = isViable(*actualSym);
                break;
            }
        }

        // Only check for typos if that functionality is enabled -- it can be
        // disabled by config or if we've tried too many times to correct typos.
        if (comp.doTypoCorrection()) {
            auto checkMembers = [&](const Scope& toCheck) {
                for (auto& member : toCheck.members()) {
                    if (member.name.empty() || !isViable(member))
                        continue;

                    int dist = editDistance(member.name, name, /* allowReplacements */ true,
                                            bestDistance);
                    if (dist < bestDistance) {
                        closestSym = &member;
                        bestDistance = dist;
                    }
                }
            };

            // Check the current scope.
            checkMembers(*scope);

            // Also search in package imports.
            if (auto importData = scope->getWildcardImportData()) {
                for (auto import : importData->wildcardImports) {
                    auto package = import->getPackage();
                    if (package)
                        checkMembers(*package);
                }
            }
        }

        scope = scope->asSymbol().getParentScope();
        if (!scope || (scope->asSymbol().kind == SymbolKind::CompilationUnit &&
                       flags.has(LookupFlags::DisallowUnitReferences))) {
            break;
        }
    }

    // If we found the actual named symbol and it's viable for our kind of lookup,
    // report a diagnostic about it being used before declared.
    if (usedBeforeDeclared) {
        auto& diag = result.addDiag(initialScope, diag::UsedBeforeDeclared, range);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, actualSym->location);
        return;
    }

    // Otherwise, check if this names a definition, in which case we can give a nicer error.
    if (auto def = comp.tryGetDefinition(name, initialScope).definition;
        def && def->kind == SymbolKind::Definition) {
        if (isHierarchical) {
            result.addDiag(initialScope, diag::CouldNotResolveHierarchicalPath, range) << name;
        }
        else {
            auto code = flags.has(LookupFlags::Type) ? diag::DefinitionUsedAsType
                                                     : diag::DefinitionUsedAsValue;
            result.addDiag(initialScope, code, range)
                << name << def->as<DefinitionSymbol>().getArticleKindString();
        }
        return;
    }

    // Also check for a package with this name.
    if (comp.getPackage(name)) {
        result.addDiag(initialScope, diag::UndeclaredButFoundPackage, range.end()) << name << range;
        return;
    }

    // Count the number of times we've performed typo correction.
    comp.didTypoCorrection();

    // See if we found a viable symbol with a name that's somewhat close to the one we wanted.
    // If we did, assume that the user made a typo and report it.
    if (closestSym && bestDistance > 0 && name.length() / size_t(bestDistance) >= 3) {
        auto& diag = result.addDiag(initialScope, diag::TypoIdentifier, range);
        diag << name << closestSym->name;
        diag.addNote(diag::NoteDeclarationHere, closestSym->location);
        return;
    }

    // We couldn't make any sense of this, just report a simple error about a missing identifier.
    result.addDiag(initialScope, diag::UndeclaredIdentifier, range) << name;
}